

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O2

void __thiscall
cppjieba::HMMSegment::InternalCut
          (HMMSegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res)

{
  size_t i;
  ulong uVar1;
  const_iterator pRVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> status;
  WordRange wr;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  value_type local_30;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Viterbi(this,begin,end,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48);
  pRVar2 = begin;
  for (uVar1 = 0;
      uVar1 < (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar1 = uVar1 + 1) {
    if ((local_48._M_impl.super__Vector_impl_data._M_start[uVar1] & 1) != 0) {
      local_30.left = begin;
      local_30.right = pRVar2;
      std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back
                (res,&local_30);
      begin = pRVar2 + 1;
    }
    pRVar2 = pRVar2 + 1;
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void InternalCut(RuneStrArray::const_iterator begin, RuneStrArray::const_iterator end, vector<WordRange>& res) const {
    vector<size_t> status;
    Viterbi(begin, end, status);

    RuneStrArray::const_iterator left = begin;
    RuneStrArray::const_iterator right;
    for (size_t i = 0; i < status.size(); i++) {
      if (status[i] % 2) { //if (HMMModel::E == status[i] || HMMModel::S == status[i])
        right = begin + i + 1;
        WordRange wr(left, right - 1);
        res.push_back(wr);
        left = right;
      }
    }
  }